

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_inline.h
# Opt level: O0

_Bool xdr_opaque_auth_decode(XDR *xdrs,opaque_auth *oa,int32_t *buf)

{
  _Bool _Var1;
  uint32_t uVar2;
  int32_t *buf_local;
  opaque_auth *oa_local;
  XDR *xdrs_local;
  
  if (buf == (int32_t *)0x0) {
    _Var1 = xdr_getenum(xdrs,&oa->oa_flavor);
    if (!_Var1) {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR oa_flavor","xdr_opaque_auth_decode",0x87);
      }
      return false;
    }
    _Var1 = xdr_getuint32(xdrs,&oa->oa_length);
    if (!_Var1) {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR oa_length","xdr_opaque_auth_decode",0x8c);
      }
      return false;
    }
  }
  else {
    uVar2 = ntohl(*buf);
    oa->oa_flavor = uVar2;
    uVar2 = ntohl(buf[1]);
    oa->oa_length = uVar2;
  }
  if (oa->oa_length == 0) {
    xdrs_local._7_1_ = true;
  }
  else {
    xdrs_local._7_1_ = xdr_opaque_auth_decode_it(xdrs,oa);
  }
  return xdrs_local._7_1_;
}

Assistant:

static inline bool
xdr_opaque_auth_decode(XDR *xdrs, struct opaque_auth *oa, int32_t *buf)
{
	if (buf != NULL) {
		oa->oa_flavor = IXDR_GET_ENUM(buf, enum_t);
		oa->oa_length = (u_int) IXDR_GET_U_INT32(buf);
	} else if (!xdr_getenum(xdrs, (enum_t *)&oa->oa_flavor)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR oa_flavor",
			__func__, __LINE__);
		return (false);
	} else if (!xdr_getuint32(xdrs, &oa->oa_length)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR oa_length",
			__func__, __LINE__);
		return (false);
	}

	if (oa->oa_length) {
		/* only call and alloc for > 0 length */
		return xdr_opaque_auth_decode_it(xdrs, oa);
	}
	return (true);	/* 0 length succeeds */
}